

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeString::UnicodeString(UnicodeString *this,char *codepageData,int32_t dataLength)

{
  size_t sVar1;
  StringPiece utf8;
  undefined1 local_30 [12];
  int local_1c;
  char *pcStack_18;
  int32_t dataLength_local;
  char *codepageData_local;
  UnicodeString *this_local;
  
  local_1c = dataLength;
  pcStack_18 = codepageData;
  codepageData_local = (char *)this;
  Replaceable::Replaceable(&this->super_Replaceable);
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_004a9298
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 2;
  if (((pcStack_18 != (char *)0x0) && (local_1c != 0)) && (-2 < local_1c)) {
    if (local_1c == -1) {
      sVar1 = strlen(pcStack_18);
      local_1c = (int)sVar1;
    }
    StringPiece::StringPiece((StringPiece *)local_30,pcStack_18,local_1c);
    utf8._12_4_ = 0;
    utf8.ptr_ = (char *)local_30._0_8_;
    utf8.length_ = local_30._8_4_;
    setToUTF8(this,utf8);
  }
  return;
}

Assistant:

UnicodeString::UnicodeString(const char *codepageData, int32_t dataLength) {
  fUnion.fFields.fLengthAndFlags = kShortString;
  // if there's nothing to convert, do nothing
  if(codepageData == 0 || dataLength == 0 || dataLength < -1) {
    return;
  }
  if(dataLength == -1) {
    dataLength = (int32_t)uprv_strlen(codepageData);
  }
  setToUTF8(StringPiece(codepageData, dataLength));
}